

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

void __thiscall pbrt::syntactic::Material::~Material(Material *this)

{
  std::__cxx11::string::~string((string *)&this->name);
  std::__cxx11::string::~string((string *)&this->type);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->attributes).
              super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
               *)this);
  return;
}

Assistant:

struct PBRT_PARSER_INTERFACE Material : public ParamSet {
      /*! a "Type::SP" shorthand for std::shared_ptr<Type> - makes code
        more concise, and easier to read */
      typedef std::shared_ptr<Material> SP;

      /*! constructor */
      Material(const std::string &type) : type(type) {};

      /*! pretty-print this material (for debugging) */
      std::string toString() const;

      Attributes::SP attributes;
    
      /*! the 'type' of the material, such as 'uber'material, 'matte',
        'mix' etc. Note that the PBRT format has two inconsistent
        ways of specifying that type: for the 'Material' command it
        specifies the type explicitly right after the 'matierla'
        command; for the 'makenamedmaterial' it uses an implicit
        'type' parameter */
      std::string type;

      /*! the logical name that this was defined under, such as
        "BackWall". Note this may be an empty string for some scenes
        (it is only defined for 'NamedMaterial's) */
      std::string name;
    }